

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<wasm::Ok> *
wasm::WATParser::table<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  Lexer *this;
  undefined8 *puVar1;
  _Uninitialized<wasm::Type,_true> _Var2;
  _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *p_Var3;
  undefined1 *puVar4;
  uint uVar5;
  size_t sVar6;
  Module *pMVar7;
  pointer puVar8;
  bool bVar9;
  bool bVar10;
  undefined8 extraout_RAX;
  undefined1 *extraout_RAX_00;
  undefined1 *extraout_RAX_01;
  mapped_type *pmVar11;
  undefined1 *extraout_RAX_02;
  _Alloc_hider _Var12;
  ImportNames *pIVar13;
  ImportNames *pIVar14;
  int iVar15;
  Type TVar16;
  Name NVar17;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  undefined1 local_1c0 [8];
  Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> exports;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  string local_178;
  string local_158;
  string local_138;
  size_t local_118;
  undefined1 local_110 [8];
  MaybeResult<wasm::WATParser::ImportNames> import;
  size_t local_e0;
  undefined1 local_d0 [8];
  MaybeResult<wasm::Type> type;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  undefined1 local_80 [8];
  Result<wasm::Type> _val_3;
  MaybeResult<wasm::Type> _val_2;
  
  this = &ctx->in;
  sVar6 = (ctx->in).pos;
  expected._M_str = "table";
  expected._M_len = 5;
  bVar9 = Lexer::takeSExprStart(this,expected);
  if (!bVar9) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  local_118 = sVar6;
  Lexer::takeID((optional<wasm::Name> *)local_1c0,this);
  if (exports.val.
      super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._M_first._M_storage.
      _M_storage[8] == '\0') {
    import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_index =
         '\0';
    import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._33_7_ = 0;
    local_e0 = 0;
  }
  else {
    import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._32_8_ =
         exports.val.
         super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
         super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
         super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._0_8_;
    local_e0 = (size_t)local_1c0;
  }
  inlineExports((Result<std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> *)local_1c0,this);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_110,
                  (_Copy_ctor_base<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                   *)local_1c0);
  if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u._24_1_
      == '\x01') {
    puVar4 = (undefined1 *)
             ((long)&type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8);
    local_d0 = (undefined1  [8])puVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,local_110,
               import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
               _M_u._M_first._M_storage.mod.super_IString.str._M_len + (long)local_110);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if (local_d0 == (undefined1  [8])puVar4) {
      *puVar1 = CONCAT71(type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._9_7_,
                         type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_)
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_d0;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._9_7_,
                    type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_);
    }
    ((_Uninitialized<wasm::Type,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
         (Type)type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first.
               _M_storage.id;
    type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.id =
         (_Uninitialized<wasm::Type,_true>)(Type)0x0;
    type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    local_d0 = (undefined1  [8])puVar4;
    std::__detail::__variant::
    _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                       *)local_110);
    goto LAB_00bd7745;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_110);
  inlineImport((MaybeResult<wasm::WATParser::ImportNames> *)local_110,this);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)local_d0
             ,(_Copy_ctor_base<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
              local_110);
  if (type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
    puVar4 = (undefined1 *)
             ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8);
    _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = puVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),local_d0,
               (undefined1 *)
               ((long)type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first.
                      _M_storage.id + (long)local_d0));
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
    if ((undefined1 *)
        _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == puVar4) {
      *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._9_7_,
                         _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_)
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._9_7_,
                    _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_);
    }
    ((_Uninitialized<wasm::Type,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
         (Type)_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first.
               _M_storage.id;
    _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.id =
         (_Uninitialized<wasm::Type,_true>)(Type)0x0;
    _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = puVar4;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_d0);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
               local_d0);
    TVar16.id = 3;
    expected_00._M_str = "i64";
    expected_00._M_len = 3;
    bVar9 = Lexer::takeKeyword(this,expected_00);
    if (!bVar9) {
      TVar16.id = 2;
      expected_01._M_str = "i32";
      expected_01._M_len = 3;
      Lexer::takeKeyword(this,expected_01);
    }
    maybeReftype<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Type> *)local_d0,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                    ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_d0);
    if (_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      _Var2._M_storage.id =
           (Type)((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 8);
      local_80 = (undefined1  [8])_Var2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,
                 _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,
                 (long)_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first
                       ._M_storage.id +
                 _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_);
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      if ((Type)local_80 == _Var2._M_storage.id) {
        *puVar1 = CONCAT71(_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                           _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_80;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                      _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::Type,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
           (Type)_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id;
      _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::Type,_true>)(Type)0x0;
      _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      local_80 = (undefined1  [8])_Var2;
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                        ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
      if (type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
        tabletypeContinued<wasm::WATParser::ParseModuleTypesCtx>
                  ((Result<wasm::Type> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx,TVar16);
        std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                  ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)local_80,
                   (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        if (_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
          local_a0 = &local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,local_80,
                     (undefined1 *)
                     ((long)_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                            _M_storage.id + (long)local_80));
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          if (local_a0 == &local_90) {
            *puVar1 = CONCAT71(uStack_8f,local_90);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 uStack_88;
          }
          else {
            *(undefined1 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_a0;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(uStack_8f,local_90);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_98;
          local_98 = 0;
          local_90 = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_a0 = &local_90;
          std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_80);
          std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                            ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          goto LAB_00bd772d;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)local_80);
        TVar16.id = _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        bVar9 = false;
LAB_00bd7475:
        bVar10 = Lexer::takeRParen(this);
        if (bVar10) {
          pIVar13 = (ImportNames *)local_1c0;
          if (exports.val.
              super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
              super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
              super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._M_u._24_1_ != '\0')
          {
            pIVar13 = (ImportNames *)0x0;
          }
          pIVar14 = (ImportNames *)local_110;
          if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u
              ._24_1_ != '\0') {
            pIVar14 = (ImportNames *)0x0;
          }
          NVar17.super_IString.str._M_str =
               (char *)import.val.
                       super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       .super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>
                       ._32_8_;
          NVar17.super_IString.str._M_len = local_e0;
          ParseModuleTypesCtx::addTable
                    ((Result<wasm::Ok> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx,NVar17,
                     (vector<wasm::Name,_std::allocator<wasm::Name>_> *)pIVar13,pIVar14,TVar16,
                     (Index)local_118);
          if (_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01')
          {
            _Var2._M_storage.id =
                 (Type)((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 8);
            local_80 = (undefined1  [8])_Var2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_80,
                       _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,
                       (long)_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u.
                             _M_first._M_storage.id +
                       _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            if ((Type)local_80 == _Var2._M_storage.id) {
              *puVar1 = CONCAT71(_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                                 _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined1 (*) [8])
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_80;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._9_7_,
                                     _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_)
              ;
            }
            ((_Uninitialized<wasm::Type,_true> *)
            ((long)&(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage
                 = (Type)_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                         _M_storage.id;
            _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
                 (_Uninitialized<wasm::Type,_true>)(Type)0x0;
            _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            local_80 = (undefined1  [8])_Var2;
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
            if (bVar9) {
              pMVar7 = ctx->wasm;
              uVar5 = ctx->index;
              puVar8 = (pMVar7->tables).
                       super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pmVar11 = std::__detail::
                        _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)ctx->implicitElemIndices,&ctx->index);
              *(undefined8 *)
               ((long)(pMVar7->elementSegments).
                      super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[*pmVar11]._M_t.
                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                      ._M_t + 0x30) =
                   *(undefined8 *)
                    ((long)puVar8[uVar5]._M_t.
                           super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                           _M_t + 0x50);
              _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ = 0;
              std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
              ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
            }
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
          }
        }
        else {
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_138,"expected end of table declaration","");
          Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),this,
                     &local_138);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
          puVar4 = (undefined1 *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8);
          if ((undefined1 *)
              _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == puVar4) {
            *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u.
                               _9_7_,_val_2.val.
                                     super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                     ._M_u._8_1_);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                 _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._16_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                 _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).
                              super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10)
                 = CONCAT71(_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u.
                            _9_7_,_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                  _M_u._8_1_);
          }
          ((_Uninitialized<wasm::Type,_true> *)
          ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
               (Type)_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first.
                     _M_storage.id;
          _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.
          id = (_Uninitialized<wasm::Type,_true>)(Type)0x0;
          _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
          local_188._M_allocated_capacity = local_138.field_2._M_allocated_capacity;
          _Var12._M_p = local_138._M_dataplus._M_p;
          _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = puVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) goto LAB_00bd7725;
        }
      }
      else {
        expected_02._M_str = "elem";
        expected_02._M_len = 4;
        bVar9 = Lexer::takeSExprStart(this,expected_02);
        if (bVar9) {
          if (import.val.super__Variant_base<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>._M_u
              ._24_1_ != '\x01') {
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"imported tables cannot have inline elements","");
            Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),this,
                       &local_178);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
            puVar4 = (undefined1 *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8);
            if ((undefined1 *)
                _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == puVar4) {
              *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 _M_u._9_7_,
                                 _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 _M_u._8_1_);
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                   _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._16_8_;
            }
            else {
              *(undefined8 *)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                   _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
              *(ulong *)((long)&(__return_storage_ptr__->val).
                                super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10
                        ) = CONCAT71(_val_2.val.
                                     super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                     ._M_u._9_7_,
                                     _val_2.val.
                                     super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                     super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>
                                     ._M_u._8_1_);
            }
            ((_Uninitialized<wasm::Type,_true> *)
            ((long)&(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage
                 = (Type)_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u.
                         _M_first._M_storage.id;
            _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first._M_storage
            .id = (_Uninitialized<wasm::Type,_true>)(Type)0x0;
            _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
            local_188._M_allocated_capacity = local_178.field_2._M_allocated_capacity;
            _Var12._M_p = local_178._M_dataplus._M_p;
            _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = puVar4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_00bd7725;
            goto LAB_00bd772d;
          }
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
          type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._36_4_ = 0;
          p_Var3 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20);
          do {
            maybeElemexpr<wasm::WATParser::ParseModuleTypesCtx>((MaybeResult<wasm::Ok> *)p_Var3,ctx)
            ;
            iVar15 = 3;
            if (_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                '\x01') {
              std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
              _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80,
                              (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)p_Var3);
              if (_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x02') {
                local_a0 = &local_90;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_a0,local_80,
                           (undefined1 *)
                           ((long)_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                                  _M_storage.id + (long)local_80));
                *(undefined8 **)
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
                if (local_a0 == &local_90) {
                  *puVar1 = CONCAT71(uStack_8f,local_90);
                  *(undefined8 *)
                   ((long)&(__return_storage_ptr__->val).
                           super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                       uStack_88;
                }
                else {
                  *(undefined1 **)
                   &(__return_storage_ptr__->val).
                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_a0;
                  *(ulong *)((long)&(__return_storage_ptr__->val).
                                    super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                            0x10) = CONCAT71(uStack_8f,local_90);
                }
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                     local_98;
                local_98 = 0;
                local_90 = 0;
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                     '\x02';
                local_a0 = &local_90;
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                  local_80);
                iVar15 = 1;
              }
              else {
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                  local_80);
                iVar15 = 0;
                type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._36_4_ =
                     SUB84(CONCAT71((int7)((ulong)extraout_RAX >> 8),1),0);
              }
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage(p_Var3);
          } while (iVar15 == 0);
          TVar16.id = (uintptr_t)extraout_RAX_00;
          if (iVar15 == 3) {
            if ((type.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._36_4_ & 1) == 0) {
              p_Var3 = (_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                               super__Move_assign_alias<wasm::Type,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20);
              do {
                maybeFuncidx<wasm::WATParser::ParseModuleTypesCtx>
                          ((MaybeResult<wasm::Ok> *)p_Var3,ctx);
                iVar15 = 5;
                if (_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ !=
                    '\x01') {
                  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                                    local_80,(_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>
                                              *)p_Var3);
                  if (_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x02') {
                    local_a0 = &local_90;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_a0,local_80,
                               (undefined1 *)
                               ((long)_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u.
                                      _M_first._M_storage.id + (long)local_80));
                    *(undefined8 **)
                     &(__return_storage_ptr__->val).
                      super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
                    if (local_a0 == &local_90) {
                      *puVar1 = CONCAT71(uStack_8f,local_90);
                      *(undefined8 *)
                       ((long)&(__return_storage_ptr__->val).
                               super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18)
                           = uStack_88;
                    }
                    else {
                      *(undefined1 **)
                       &(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_a0;
                      *(ulong *)((long)&(__return_storage_ptr__->val).
                                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>
                                + 0x10) = CONCAT71(uStack_8f,local_90);
                    }
                    *(undefined8 *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
                         local_98;
                    local_98 = 0;
                    local_90 = 0;
                    *(__index_type *)
                     ((long)&(__return_storage_ptr__->val).
                             super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                         '\x02';
                    local_a0 = &local_90;
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80)
                    ;
                    iVar15 = 1;
                  }
                  else {
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_80)
                    ;
                    iVar15 = 0;
                  }
                }
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
                ~_Variant_storage(p_Var3);
              } while (iVar15 == 0);
              TVar16.id = (uintptr_t)extraout_RAX_01;
              if (iVar15 != 5) goto LAB_00bd7833;
            }
            bVar9 = Lexer::takeRParen(this);
            if (!bVar9) {
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,"expected end of inline elems","");
              Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),this,
                         &local_158);
              *(undefined8 **)
               &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
              TVar16.id = (long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8;
              if (_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == TVar16.id) {
                *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                   .super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   _M_u._9_7_,
                                   _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                   .super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   _M_u._8_1_);
                *(undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
                     _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._16_8_;
              }
              else {
                *(undefined8 *)
                 &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                  .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
                     _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
                *(ulong *)((long)&(__return_storage_ptr__->val).
                                  super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> +
                          0x10) =
                     CONCAT71(_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u.
                              _9_7_,_val_2.val.
                                    super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                    _M_u._8_1_);
              }
              ((_Uninitialized<wasm::Type,_true> *)
              ((long)&(__return_storage_ptr__->val).
                      super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->
              _M_storage = (Type)_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                 _M_u._M_first._M_storage.id;
              _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first.
              _M_storage.id = (_Uninitialized<wasm::Type,_true>)(Type)0x0;
              _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
              *(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                   '\x02';
              _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = TVar16.id;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
                TVar16.id = (uintptr_t)extraout_RAX_02;
              }
              iVar15 = 1;
              goto LAB_00bd7833;
            }
            iVar15 = 0;
            bVar9 = true;
            TVar16.id = (uintptr_t)local_d0;
          }
          else {
LAB_00bd7833:
            bVar9 = false;
          }
          if (iVar15 != 0) goto LAB_00bd772d;
          goto LAB_00bd7475;
        }
        exports.val.
        super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
        super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
        super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ = &local_188;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   ((long)&exports.val.
                           super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20),
                   "expected table limits or inline elements","");
        Lexer::err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),this,
                   (string *)
                   ((long)&exports.val.
                           super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                           .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err> + 0x20));
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        puVar4 = (undefined1 *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8);
        if ((undefined1 *)
            _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ == puVar4) {
          *puVar1 = CONCAT71(_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u.
                             _9_7_,_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>
                                   .super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>.
                                   _M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
               _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._9_7_,
                        _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_);
        }
        ((_Uninitialized<wasm::Type,_true> *)
        ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
             (Type)_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first.
                   _M_storage.id;
        _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.id
             = (_Uninitialized<wasm::Type,_true>)(Type)0x0;
        _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        _Var12._M_p = (pointer)exports.val.
                               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                               .super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
                               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>.
                               _32_8_;
        _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = puVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)exports.val.
               super__Variant_base<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>.
               super__Move_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_assign_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Move_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Copy_ctor_alias<std::vector<wasm::Name>,_wasm::Err>.
               super__Variant_storage_alias<std::vector<wasm::Name>,_wasm::Err>._32_8_ == &local_188
           ) goto LAB_00bd772d;
LAB_00bd7725:
        _val_3.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ =
             (long)&_val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 8;
        _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
        _val_2.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._M_first._M_storage.id
             = (_Uninitialized<wasm::Type,_true>)(Type)0x0;
        operator_delete(_Var12._M_p,local_188._M_allocated_capacity + 1);
      }
    }
LAB_00bd772d:
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_d0);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::ImportNames,_wasm::None,_wasm::Err> *)
             local_110);
LAB_00bd7745:
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_wasm::Err>
                     *)local_1c0);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> table(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("table"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto exports = inlineExports(ctx.in);
  CHECK_ERR(exports);

  auto import = inlineImport(ctx.in);
  CHECK_ERR(import);

  auto addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }

  // Reftype if we have inline elements.
  auto type = maybeReftype(ctx);
  CHECK_ERR(type);

  std::optional<typename Ctx::TableTypeT> ttype;
  std::optional<typename Ctx::ElemListT> elems;
  if (type) {
    // We should have inline elements.
    if (!ctx.in.takeSExprStart("elem"sv)) {
      return ctx.in.err("expected table limits or inline elements");
    }
    if (import) {
      return ctx.in.err("imported tables cannot have inline elements");
    }

    auto list = ctx.makeElemList(*type);
    bool foundElem = false;
    while (auto elem = maybeElemexpr(ctx)) {
      CHECK_ERR(elem);
      ctx.appendElem(list, *elem);
      foundElem = true;
    }

    // If there were no elemexprs, then maybe we have funcidxs instead.
    if (!foundElem) {
      while (auto func = maybeFuncidx(ctx)) {
        CHECK_ERR(func);
        ctx.appendFuncElem(list, *func);
      }
    }

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of inline elems");
    }
    ttype = ctx.makeTableType(addressType, ctx.getLimitsFromElems(list), *type);
    elems = std::move(list);
  } else {
    auto tabtype = tabletypeContinued(ctx, addressType);
    CHECK_ERR(tabtype);
    ttype = *tabtype;
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of table declaration");
  }

  CHECK_ERR(ctx.addTable(name, *exports, import.getPtr(), *ttype, pos));

  if (elems) {
    CHECK_ERR(ctx.addImplicitElems(*type, std::move(*elems)));
  }

  return Ok{};
}